

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::asString
          (lang *this,unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *expr)

{
  SourceLocation *__args_2;
  pointer pEVar1;
  ASTNode *this_00;
  unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_> local_28;
  undefined1 local_1e [8];
  Opcode opc;
  LiteralType baseType;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *expr_local;
  
  unique0x10000113 = (SourceLocation *)expr;
  expr_local = (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)this;
  pEVar1 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator->
                     (expr);
  local_1e._2_4_ = (*(pEVar1->super_ASTNode)._vptr_ASTNode[3])();
  if (local_1e._2_4_ == 3) {
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::unique_ptr
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)this,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
               stack0xffffffffffffffe8);
  }
  else {
    pEVar1 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                       ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                        stack0xffffffffffffffe8);
    local_1e._0_2_ = makeOperator(StringType,pEVar1);
    __args_2 = stack0xffffffffffffffe8;
    if (local_1e._0_2_ == EXIT) {
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
      unique_ptr<std::default_delete<flow::lang::Expr>,void>
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                 (nullptr_t)0x0);
    }
    else {
      this_00 = &std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                 operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                            stack0xffffffffffffffe8)->super_ASTNode;
      ASTNode::location(this_00);
      std::
      make_unique<flow::lang::UnaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                ((Opcode *)&local_28,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_1e,
                 __args_2);
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
      unique_ptr<flow::lang::UnaryExpr,std::default_delete<flow::lang::UnaryExpr>,void>
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                 &local_28);
      std::unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_>::
      ~unique_ptr(&local_28);
    }
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> asString(std::unique_ptr<Expr>&& expr) {
  LiteralType baseType = expr->getType();
  if (baseType == LiteralType::String) return std::move(expr);

  Opcode opc = makeOperator(Token::StringType, expr.get());
  if (opc == Opcode::EXIT) return nullptr;  // cast error

  return std::make_unique<UnaryExpr>(opc, std::move(expr), expr->location());
}